

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

string * Sophus::details::FormatString<>(string *__return_storage_ptr__,char *text)

{
  stringstream local_1a0 [8];
  stringstream stream;
  char *text_local;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  FormatStream((stringstream *)local_1a0,text);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(char const* text, Args&&... args) {
  std::stringstream stream;
  FormatStream(stream, text, std::forward<Args>(args)...);
  return stream.str();
}